

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigInd.c
# Opt level: O1

int Saig_ManInduction(Aig_Man_t *p,int nTimeOut,int nFramesMax,int nConfMax,int fUnique,
                     int fUniqueAll,int fGetCex,int fVerbose,int fVeryVerbose)

{
  ABC_INT64_T AVar1;
  bool bVar2;
  Vec_Ptr_t *vPos;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  uint *puVar9;
  void *pvVar10;
  sat_solver *psVar11;
  Cnf_Dat_t *pCVar12;
  ulong uVar13;
  Abc_Cex_t *pAVar14;
  int iVar15;
  Aig_Man_t *pAVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  size_t __size;
  uint uVar21;
  char *__format;
  uint uVar22;
  uint uVar23;
  long lVar24;
  uint k;
  ulong uVar25;
  long lVar26;
  bool bVar27;
  int nClauses;
  Aig_Man_t *local_f8;
  ulong local_f0;
  char local_e1;
  uint local_e0;
  int local_dc;
  sat_solver *local_d8;
  int nSatVarNum;
  Cnf_Dat_t *local_c8;
  int Lits [2];
  Vec_Ptr_t *local_b8;
  Vec_Int_t *local_b0;
  Vec_Ptr_t *local_a8;
  ulong local_a0;
  int *local_98;
  uint *local_90;
  uint local_88;
  uint local_84;
  Aig_Man_t *local_80;
  timespec ts;
  long local_40;
  
  nClauses = 0;
  local_f8 = p;
  local_88 = fUniqueAll;
  local_84 = fUnique;
  if (nTimeOut == 0) {
    lVar24 = 0;
  }
  else {
    iVar3 = clock_gettime(3,(timespec *)&ts);
    if (iVar3 < 0) {
      lVar24 = -1;
    }
    else {
      lVar24 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    lVar24 = lVar24 + (long)nTimeOut * 1000000;
  }
  pAVar16 = local_f8;
  if (local_88 != 0 && local_84 != 0) {
    __assert_fail("fUnique == 0 || fUniqueAll == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                  ,0xa0,"int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                 );
  }
  if (local_f8->nTruePos != 1) {
    __assert_fail("Saig_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                  ,0xa1,"int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                 );
  }
  Aig_ManSetCioIds(local_f8);
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  local_b8 = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar7->pArray = piVar8;
  if (pAVar16->vCos->nSize < 1) {
LAB_006e077c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar10 = *pAVar16->vCos->pArray;
  pVVar5->nSize = 1;
  *pVVar5->pArray = pvVar10;
  puVar9 = (uint *)malloc(0x10);
  puVar9[0] = 100;
  puVar9[1] = 0;
  pvVar10 = malloc(400);
  *(void **)(puVar9 + 2) = pvVar10;
  local_90 = puVar9;
  psVar11 = sat_solver_new();
  sat_solver_setnvars(psVar11,1000);
  if (lVar24 != 0) {
    psVar11->nRuntimeLimit = lVar24;
  }
  nSatVarNum = 0;
  local_d8 = psVar11;
  local_a8 = pVVar5;
  if (fVerbose != 0) {
    printf("Induction parameters: FramesMax = %5d. ConflictMax = %6d.\n",nFramesMax,
           (ulong)(uint)nConfMax);
  }
  local_98 = (int *)0x0;
  local_e0 = 0;
  uVar23 = 0;
  local_c8 = (Cnf_Dat_t *)0x0;
  pAVar16 = (Aig_Man_t *)0x0;
  local_b0 = pVVar7;
  do {
    if (local_e0 != 0) {
      Aig_ManStop(pAVar16);
      Cnf_DataFree(local_c8);
    }
    iVar3 = clock_gettime(3,(timespec *)&ts);
    vPos = local_a8;
    pVVar5 = local_b8;
    pAVar16 = local_f8;
    if (iVar3 < 0) {
      local_40 = 1;
    }
    else {
      lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
      local_40 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + ts.tv_sec * -1000000;
    }
    Aig_SupportNodes(local_f8,(Aig_Obj_t **)local_a8->pArray,local_a8->nSize,local_b8);
    local_80 = Aig_ManDupSimpleDfsPart(pAVar16,pVVar5,vPos);
    pCVar12 = Cnf_Derive(local_80,local_80->nObjs[3]);
    iVar3 = nSatVarNum;
    Cnf_DataLift(pCVar12,nSatVarNum);
    psVar11 = local_d8;
    nSatVarNum = iVar3 + pCVar12->nVars;
    nClauses = nClauses + pCVar12->nClauses;
    local_c8 = pCVar12;
    if (local_98 == (int *)0x0 && fGetCex != 0) {
      iVar3 = local_f8->nObjs[2];
      local_98 = (int *)malloc(0x10);
      iVar4 = iVar3;
      if (iVar3 - 1U < 0xf) {
        iVar4 = 0x10;
      }
      local_98[1] = 0;
      *local_98 = iVar4;
      if (iVar4 == 0) {
        pvVar10 = (void *)0x0;
      }
      else {
        pvVar10 = malloc((long)iVar4 << 2);
      }
      *(void **)(local_98 + 2) = pvVar10;
      local_98[1] = iVar3;
      if (pvVar10 != (void *)0x0) {
        memset(pvVar10,0xff,(long)iVar3 << 2);
      }
      pVVar5 = local_f8->vCis;
      if (0 < pVVar5->nSize) {
        ppvVar6 = pVVar5->pArray;
        lVar18 = 0;
        do {
          piVar8 = (int *)ppvVar6[lVar18];
          lVar26 = *(long *)(piVar8 + 10);
          if (lVar26 != 0) {
            if ((*(uint *)(lVar26 + 0x18) & 7) != 2) {
              __assert_fail("Aig_ObjIsCi(pObjPiCopy)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                            ,0xd3,
                            "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                           );
            }
            if (((uint)*(undefined8 *)(piVar8 + 6) & 7) != 2) {
LAB_006e081f:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                            ,0xd8,
                            "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                           );
            }
            if (*piVar8 < local_f8->nTruePis) {
              uVar22 = local_f8->nRegs + *piVar8;
            }
            else {
              if (*piVar8 < local_f8->nTruePis) goto LAB_006e081f;
              uVar22 = *piVar8 - local_f8->nTruePis;
            }
            if (((int)uVar22 < 0) || (local_98[1] <= (int)uVar22)) goto LAB_006e075d;
            *(int *)((long)pvVar10 + (ulong)uVar22 * 4) =
                 local_c8->pVarNums[*(int *)(lVar26 + 0x24)];
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < pVVar5->nSize);
      }
    }
    local_a0 = (ulong)(int)local_90[1];
    if (local_80->nObjs[3] - 1U != local_90[1]) {
      __assert_fail("Aig_ManCoNum(pAigPart)-1 == Vec_IntSize(vTopVarNums)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                    ,0xdd,
                    "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)");
    }
    pVVar5 = local_80->vCos;
    iVar3 = nClauses;
    if (0 < pVVar5->nSize) {
      bVar27 = local_e0 != 0;
      lVar18 = 0;
      do {
        pCVar12 = local_c8;
        psVar11 = local_d8;
        pvVar10 = pVVar5->pArray[lVar18];
        if (lVar18 == 0) {
          Lits[0] = (uint)bVar27 + local_c8->pVarNums[*(int *)((long)pvVar10 + 0x24)] * 2;
          iVar4 = sat_solver_addclause(local_d8,Lits,Lits + 1);
          iVar15 = 1;
          if (iVar4 == 0) {
            nClauses = iVar3;
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                          ,0xe8,
                          "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                         );
          }
        }
        else {
          local_f0 = CONCAT44(local_f0._4_4_,iVar3);
          if ((long)local_a0 < lVar18) {
            nClauses = iVar3;
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          lVar26 = *(long *)(local_90 + 2);
          Lits[0] = *(int *)(lVar26 + -4 + lVar18 * 4) * 2;
          Lits[1] = local_c8->pVarNums[*(int *)((long)pvVar10 + 0x24)] * 2 + 1;
          iVar3 = sat_solver_addclause(local_d8,Lits,(lit *)&local_b8);
          if (iVar3 == 0) {
            nClauses = (int)local_f0;
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                          ,0xef,
                          "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                         );
          }
          Lits[0] = *(int *)(lVar26 + -4 + lVar18 * 4) * 2 + 1;
          Lits[1] = pCVar12->pVarNums[*(int *)((long)pvVar10 + 0x24)] * 2;
          iVar4 = sat_solver_addclause(psVar11,Lits,(lit *)&local_b8);
          iVar15 = 2;
          iVar3 = (int)local_f0;
          if (iVar4 == 0) {
            nClauses = (int)local_f0;
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                          ,0xf3,
                          "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                         );
          }
        }
        iVar3 = iVar3 + iVar15;
        lVar18 = lVar18 + 1;
        pVVar5 = local_80->vCos;
      } while (lVar18 < pVVar5->nSize);
    }
    pCVar12 = local_c8;
    lVar18 = 0;
    nClauses = iVar3;
    do {
      lVar26 = lVar18;
      if (pCVar12->nClauses <= lVar26) break;
      iVar3 = sat_solver_addclause(psVar11,pCVar12->pClauses[lVar26],pCVar12->pClauses[lVar26 + 1]);
      lVar18 = lVar26 + 1;
    } while (iVar3 != 0);
    pVVar7 = local_b0;
    if ((int)lVar26 < pCVar12->nClauses) {
LAB_006e048e:
      bVar27 = false;
      local_dc = 1;
      goto LAB_006e0566;
    }
    local_a8->nSize = 0;
    if (local_f8->vCos->nSize < 1) goto LAB_006e077c;
    pvVar10 = *local_f8->vCos->pArray;
    if (local_a8->nCap == 0) {
      if (local_a8->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(local_a8->pArray,0x80);
      }
      local_a8->pArray = ppvVar6;
      local_a8->nCap = 0x10;
    }
    iVar3 = local_a8->nSize;
    local_a8->nSize = iVar3 + 1;
    local_a8->pArray[iVar3] = pvVar10;
    local_90[1] = 0;
    local_f0 = (ulong)pVVar7->nSize;
    iVar3 = local_f8->nRegs;
    if (0 < (long)iVar3) {
      lVar18 = (long)iVar3 + local_f0;
      iVar4 = pVVar7->nCap;
      iVar15 = iVar4 * 2;
      iVar19 = (int)lVar18;
      if (iVar15 < iVar19) {
        if (iVar4 < iVar19) {
          __size = lVar18 * 4;
          if (pVVar7->pArray == (int *)0x0) {
            piVar8 = (int *)malloc(__size);
          }
          else {
            piVar8 = (int *)realloc(pVVar7->pArray,__size);
          }
          pVVar7->pArray = piVar8;
          iVar15 = iVar19;
LAB_006dfdcf:
          if (piVar8 == (int *)0x0) {
LAB_006e08e9:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar7->nCap = iVar15;
        }
      }
      else if (iVar4 < iVar15 && iVar4 < iVar19) {
        if (pVVar7->pArray == (int *)0x0) {
          piVar8 = (int *)malloc((long)iVar4 << 3);
        }
        else {
          piVar8 = (int *)realloc(pVVar7->pArray,(long)iVar4 << 3);
        }
        pVVar7->pArray = piVar8;
        goto LAB_006dfdcf;
      }
      memset(pVVar7->pArray + local_f0,0xff,(ulong)(iVar3 - 1) * 4 + 4);
      pVVar7->nSize = iVar19;
    }
    pAVar16 = local_f8;
    if (0 < local_b8->nSize) {
      lVar18 = 0;
      pVVar5 = local_b8;
      uVar25 = local_f0;
      do {
        piVar8 = (int *)pVVar5->pArray[lVar18];
        if (((uint)*(undefined8 *)(piVar8 + 6) & 7) != 2) {
          __assert_fail("Aig_ObjIsCi(pObjPi)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0x109,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
        if (pAVar16->nTruePis <= *piVar8) {
          lVar26 = *(long *)(piVar8 + 10);
          if (lVar26 == 0) {
            __assert_fail("pObjPiCopy != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                          ,0x10d,
                          "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                         );
          }
          if (*piVar8 < pAVar16->nTruePis) {
            __assert_fail("Saig_ObjIsLo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saig.h"
                          ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
          }
          uVar22 = (*piVar8 - pAVar16->nTruePis) + pAVar16->nTruePos;
          if (((int)uVar22 < 0) || (pAVar16->vCos->nSize <= (int)uVar22)) goto LAB_006e077c;
          pvVar10 = pAVar16->vCos->pArray[uVar22];
          uVar22 = local_a8->nCap;
          if (local_a8->nSize == uVar22) {
            if ((int)uVar22 < 0x10) {
              if (local_a8->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(local_a8->pArray,0x80);
              }
              iVar3 = 0x10;
            }
            else {
              iVar3 = uVar22 * 2;
              if (iVar3 <= (int)uVar22) goto LAB_006dff07;
              if (local_a8->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar22 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(local_a8->pArray,(ulong)uVar22 << 4);
              }
            }
            local_a8->pArray = ppvVar6;
            local_a8->nCap = iVar3;
            pVVar5 = local_b8;
            pAVar16 = local_f8;
            uVar25 = local_f0;
          }
LAB_006dff07:
          iVar3 = local_a8->nSize;
          local_a8->nSize = iVar3 + 1;
          local_a8->pArray[iVar3] = pvVar10;
          iVar3 = local_c8->pVarNums[*(int *)(lVar26 + 0x24)];
          uVar22 = local_90[1];
          uVar21 = *local_90;
          if (uVar22 == uVar21) {
            if ((int)uVar21 < 0x10) {
              local_a0 = CONCAT44(local_a0._4_4_,iVar3);
              if (*(void **)(local_90 + 2) == (void *)0x0) {
                pvVar10 = malloc(0x40);
              }
              else {
                pvVar10 = realloc(*(void **)(local_90 + 2),0x40);
              }
              *(void **)(local_90 + 2) = pvVar10;
              uVar20 = 0x10;
            }
            else {
              uVar20 = uVar21 * 2;
              if ((int)uVar20 <= (int)uVar21) goto LAB_006dffd5;
              local_a0 = CONCAT44(local_a0._4_4_,iVar3);
              if (*(void **)(local_90 + 2) == (void *)0x0) {
                pvVar10 = malloc((ulong)uVar21 << 3);
              }
              else {
                pvVar10 = realloc(*(void **)(local_90 + 2),(ulong)uVar21 << 3);
              }
              *(void **)(local_90 + 2) = pvVar10;
            }
            if (pvVar10 == (void *)0x0) goto LAB_006e08e9;
            *local_90 = uVar20;
            pVVar5 = local_b8;
            pAVar16 = local_f8;
            uVar25 = local_f0;
            iVar3 = (int)local_a0;
          }
LAB_006dffd5:
          local_90[1] = uVar22 + 1;
          *(int *)(*(long *)(local_90 + 2) + (long)(int)uVar22 * 4) = iVar3;
          iVar3 = *piVar8 - pAVar16->nTruePis;
          if ((iVar3 < 0) || (pAVar16->nRegs <= iVar3)) {
            __assert_fail("iReg >= 0 && iReg < Aig_ManRegNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                          ,0x112,
                          "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                         );
          }
          uVar22 = iVar3 + (int)uVar25;
          if (((int)uVar22 < 0) || (local_b0->nSize <= (int)uVar22)) {
LAB_006e075d:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          local_b0->pArray[uVar22] = local_c8->pVarNums[*(int *)(lVar26 + 0x24)];
          pVVar7 = local_b0;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < pVVar5->nSize);
    }
    uVar22 = pVVar7->nSize;
    local_a0 = (ulong)uVar22;
    uVar25 = (long)(int)uVar22 / (long)pAVar16->nRegs;
    uVar13 = uVar25 & 0xffffffff;
    uVar21 = (uint)uVar25;
    if ((int)uVar22 % pAVar16->nRegs != 0) {
      __assert_fail("Vec_IntSize(vState)%Aig_ManRegNum(p) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                    ,0x116,
                    "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)");
    }
    uVar22 = uVar23;
    local_f0 = uVar13;
    if (local_88 != 0) {
      bVar27 = 2 < (int)uVar21;
      if (2 < (int)uVar21) {
        uVar20 = uVar21 - 1;
        uVar22 = (uVar23 + uVar21) - 2;
        uVar25 = 1;
        do {
          iVar3 = (int)uVar25;
          if (fVeryVerbose != 0) {
            printf("Adding constaint for state %2d and state %2d.\n",uVar25,(ulong)uVar20);
            pAVar16 = local_f8;
          }
          iVar4 = Saig_ManAddUniqueness
                            (local_d8,local_b0,pAVar16->nRegs,iVar3,uVar20,&nSatVarNum,&nClauses,
                             fVerbose);
          if (iVar4 != 0) {
            uVar22 = uVar23 + iVar3;
            break;
          }
          bVar27 = (int)(iVar3 + 1U) < (int)uVar20;
          uVar25 = (ulong)(iVar3 + 1U);
          pAVar16 = local_f8;
        } while (iVar3 - uVar21 != -2);
        uVar21 = (uint)local_f0;
        pVVar7 = local_b0;
      }
      uVar23 = uVar22;
      if (bVar27) break;
    }
    local_e1 = local_e0 == nFramesMax - 1U && nFramesMax != 0;
    uVar23 = uVar22;
    uVar20 = 1;
    if (1 < (int)uVar21) {
      uVar20 = uVar21;
    }
    do {
      psVar11 = local_d8;
      AVar1 = (local_d8->stats).conflicts;
      iVar3 = sat_solver_solve(local_d8,(lit *)0x0,(lit *)0x0,(long)nConfMax,0,0,0);
      if (fVerbose != 0) {
        iVar4 = 0xa2f847;
        printf("Frame %4d : PI =%5d. PO =%5d. AIG =%5d. Var =%7d. Clau =%7d. Conf =%7d. ",
               (ulong)local_e0,(ulong)(uint)local_80->nObjs[2],(ulong)(uint)local_80->nObjs[3],
               (ulong)(uint)(local_80->nObjs[6] + local_80->nObjs[5]),(ulong)(uint)nSatVarNum,
               (ulong)(uint)nClauses,(ulong)(uint)((int)(psVar11->stats).conflicts - (int)AVar1));
        Abc_Print(iVar4,"%s =","Time");
        iVar15 = 3;
        iVar4 = clock_gettime(3,(timespec *)&ts);
        if (iVar4 < 0) {
          lVar18 = -1;
        }
        else {
          lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar18 + local_40) / 1000000.0);
      }
      if (iVar3 != 1) {
        if (iVar3 == -1) goto LAB_006e048e;
        local_dc = -1;
        bVar27 = true;
        if (iVar3 != 0) {
          __assert_fail("status == l_True",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0x13c,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
        goto LAB_006e0566;
      }
      local_dc = -1;
      if (fVeryVerbose != 0) {
        if (0 < (int)local_a0) {
          piVar8 = pVVar7->pArray;
          uVar25 = 0;
          do {
            uVar21 = piVar8[uVar25];
            uVar17 = (int)uVar25 >> 0x1f;
            if ((uVar25 != 0) &&
               ((int)((long)((ulong)uVar17 << 0x20 | uVar25 & 0xffffffff) % (long)local_f8->nRegs)
                == 0)) {
              putchar(10);
            }
            iVar3 = local_f8->nRegs;
            if ((int)((long)((ulong)uVar17 << 0x20 | uVar25 & 0xffffffff) % (long)iVar3) == 0) {
              uVar13 = (ulong)uVar17 << 0x20 | uVar25 & 0xffffffff;
              printf("       State %3d : ",(long)uVar13 / (long)iVar3 & 0xffffffff,
                     (long)uVar13 % (long)iVar3 & 0xffffffff);
            }
            if ((int)uVar21 < 0) {
              uVar21 = 0x78;
            }
            else {
              if (psVar11->size <= (int)uVar21) goto LAB_006e073e;
              uVar21 = psVar11->model[uVar21] == 1 | 0x30;
            }
            putchar(uVar21);
            uVar25 = uVar25 + 1;
          } while (local_a0 != uVar25);
        }
        putchar(10);
      }
      if (local_e1 != '\0') goto LAB_006e049e;
      if (local_84 == 0) {
        bVar27 = false;
      }
      else {
        bVar27 = false;
        uVar25 = local_f0;
        pAVar16 = local_f8;
        uVar21 = 1;
        do {
          uVar17 = uVar21;
          iVar3 = (int)uVar25;
          if (uVar17 == uVar20) break;
          uVar21 = uVar17 + 1;
          bVar2 = (int)uVar21 < iVar3;
          k = uVar21;
          if ((int)uVar21 < iVar3) {
            do {
              iVar3 = Saig_ManStatesAreEqual(local_d8,local_b0,pAVar16->nRegs,uVar17,k);
              pAVar16 = local_f8;
              if (iVar3 != 0) {
                if (fVeryVerbose != 0) {
                  printf("Adding constaint for state %2d and state %2d.\n",(ulong)uVar17,(ulong)k);
                }
                pAVar16 = local_f8;
                uVar23 = uVar23 + 1;
                iVar3 = Saig_ManAddUniqueness
                                  (local_d8,local_b0,local_f8->nRegs,uVar17,k,&nSatVarNum,&nClauses,
                                   fVerbose);
                bVar27 = true;
                uVar25 = local_f0;
                if (iVar3 != 0) break;
              }
              k = k + 1;
              bVar2 = (int)k < (int)(uint)local_f0;
              uVar25 = local_f0;
            } while (k != (uint)local_f0);
          }
          iVar3 = (int)uVar25;
        } while (!bVar2);
        pVVar7 = local_b0;
        if ((int)uVar17 < iVar3) goto LAB_006e0561;
      }
    } while (bVar27);
    local_e0 = local_e0 + 1;
    pAVar16 = local_80;
  } while( true );
LAB_006e0561:
  local_dc = 1;
  bVar27 = false;
  psVar11 = local_d8;
  goto LAB_006e0566;
LAB_006e049e:
  iVar3 = 0;
  if (fGetCex != 0) {
    pAVar14 = Abc_CexAlloc(local_f8->nRegs + -1,local_f8->nTruePis,1);
    pAVar16 = local_f8;
    pAVar14->iPo = 0;
    pAVar14->iFrame = 0;
    if (1 < local_98[1]) {
      lVar18 = *(long *)(local_98 + 2);
      lVar26 = 1;
      do {
        iVar3 = *(int *)(lVar18 + lVar26 * 4);
        if (-1 < (long)iVar3) {
          if (psVar11->size <= iVar3) {
LAB_006e073e:
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          if (psVar11->model[iVar3] == 1) {
            (&pAVar14[1].iPo)[lVar26 - 1U >> 5 & 0x7ffffff] =
                 (&pAVar14[1].iPo)[lVar26 - 1U >> 5 & 0x7ffffff] | 1 << ((byte)(lVar26 - 1U) & 0x1f)
            ;
          }
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 < local_98[1]);
      iVar3 = (int)lVar26 + -1;
    }
    if (iVar3 != pAVar14->nBits) {
      __assert_fail("iBit == pCex->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                    ,0x15a,
                    "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)");
    }
    Abc_CexFree(local_f8->pSeqModel);
    pAVar16->pSeqModel = pAVar14;
  }
  bVar27 = false;
  uVar23 = uVar22;
LAB_006e0566:
  if (fVerbose == 0) goto LAB_006e0632;
  if (lVar24 == 0) {
LAB_006e05d8:
    if (bVar27) {
      uVar13 = (ulong)(local_e0 + 1);
      __format = "Conflict limit (%d) was reached during iteration %d.\n";
      uVar25 = (ulong)(uint)nConfMax;
    }
    else {
      uVar25 = (ulong)(local_e0 + 1);
      local_88 = local_88 | local_84;
      if (local_88 == 0) {
        printf("Completed %d iterations.\n",uVar25);
        goto LAB_006e0632;
      }
      __format = "Completed %d iterations and added %d uniqueness constraints.\n";
      uVar13 = (ulong)uVar23;
    }
  }
  else {
    iVar3 = clock_gettime(3,(timespec *)&ts);
    if (iVar3 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    if (lVar18 < lVar24) goto LAB_006e05d8;
    uVar13 = (ulong)(local_e0 + 1);
    __format = "Timeout (%d sec) was reached during iteration %d.\n";
    uVar25 = (ulong)(uint)nTimeOut;
  }
  printf(__format,uVar25,uVar13);
LAB_006e0632:
  sat_solver_delete(psVar11);
  Aig_ManStop(local_80);
  Cnf_DataFree(local_c8);
  puVar9 = local_90;
  if (*(void **)(local_90 + 2) != (void *)0x0) {
    free(*(void **)(local_90 + 2));
    puVar9[2] = 0;
    puVar9[3] = 0;
  }
  free(puVar9);
  piVar8 = local_98;
  pVVar5 = local_a8;
  if (local_a8->pArray != (void **)0x0) {
    free(local_a8->pArray);
    pVVar5->pArray = (void **)0x0;
  }
  free(pVVar5);
  if (local_b8->pArray != (void **)0x0) {
    free(local_b8->pArray);
    local_b8->pArray = (void **)0x0;
  }
  free(local_b8);
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  free(pVVar7);
  if (piVar8 != (int *)0x0) {
    if (*(void **)(piVar8 + 2) != (void *)0x0) {
      free(*(void **)(piVar8 + 2));
      piVar8[2] = 0;
      piVar8[3] = 0;
    }
    free(piVar8);
  }
  return local_dc;
}

Assistant:

int Saig_ManInduction( Aig_Man_t * p, int nTimeOut, int nFramesMax, int nConfMax, int fUnique, int fUniqueAll, int fGetCex, int fVerbose, int fVeryVerbose )
{
    sat_solver * pSat;
    Aig_Man_t * pAigPart = NULL;
    Cnf_Dat_t * pCnfPart = NULL;
    Vec_Int_t * vTopVarNums, * vState, * vTopVarIds = NULL;
    Vec_Ptr_t * vTop, * vBot;
    Aig_Obj_t * pObjPi, * pObjPiCopy, * pObjPo;
    int i, k, f, Lits[2], status = -1, RetValue, nSatVarNum, nConfPrev;
    int nOldSize, iReg, iLast, fAdded, nConstrs = 0, nClauses = 0;
    abctime clk, nTimeToStop = nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock() : 0;
    assert( fUnique == 0 || fUniqueAll == 0 );
    assert( Saig_ManPoNum(p) == 1 );
    Aig_ManSetCioIds( p );

    // start the top by including the PO
    vBot = Vec_PtrAlloc( 100 );
    vTop = Vec_PtrAlloc( 100 );
    vState = Vec_IntAlloc( 1000 );
    Vec_PtrPush( vTop, Aig_ManCo(p, 0) );
    // start the array of CNF variables
    vTopVarNums = Vec_IntAlloc( 100 );
    // start the solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 1000 );

    // set runtime limit
    if ( nTimeToStop )
        sat_solver_set_runtime_limit( pSat, nTimeToStop );

    // iterate backward unrolling
    RetValue = -1;
    nSatVarNum = 0;
    if ( fVerbose )
        printf( "Induction parameters: FramesMax = %5d. ConflictMax = %6d.\n", nFramesMax, nConfMax );
    for ( f = 0; ; f++ )
    { 
        if ( f > 0 )
        {
            Aig_ManStop( pAigPart );
            Cnf_DataFree( pCnfPart );
        }
        clk = Abc_Clock();
        // get the bottom
        Aig_SupportNodes( p, (Aig_Obj_t **)Vec_PtrArray(vTop), Vec_PtrSize(vTop), vBot );
        // derive AIG for the part between top and bottom
        pAigPart = Aig_ManDupSimpleDfsPart( p, vBot, vTop );
        // convert it into CNF
        pCnfPart = Cnf_Derive( pAigPart, Aig_ManCoNum(pAigPart) );
        Cnf_DataLift( pCnfPart, nSatVarNum );
        nSatVarNum += pCnfPart->nVars;
        nClauses   += pCnfPart->nClauses;

        // remember top frame var IDs
        if ( fGetCex && vTopVarIds == NULL )
        {
            vTopVarIds = Vec_IntStartFull( Aig_ManCiNum(p) );
            Aig_ManForEachCi( p, pObjPi, i )
            {
                if ( pObjPi->pData == NULL )
                    continue;
                pObjPiCopy = (Aig_Obj_t *)pObjPi->pData;
                assert( Aig_ObjIsCi(pObjPiCopy) );
                if ( Saig_ObjIsPi(p, pObjPi) )
                    Vec_IntWriteEntry( vTopVarIds, Aig_ObjCioId(pObjPi) + Saig_ManRegNum(p), pCnfPart->pVarNums[Aig_ObjId(pObjPiCopy)] );
                else if ( Saig_ObjIsLo(p, pObjPi) )
                    Vec_IntWriteEntry( vTopVarIds, Aig_ObjCioId(pObjPi) - Saig_ManPiNum(p), pCnfPart->pVarNums[Aig_ObjId(pObjPiCopy)] );
                else assert( 0 );
            }
        }

        // stitch variables of top and bot
        assert( Aig_ManCoNum(pAigPart)-1 == Vec_IntSize(vTopVarNums) );
        Aig_ManForEachCo( pAigPart, pObjPo, i )
        {
            if ( i == 0 )
            {
                // do not perform inductive strengthening
//                if ( f > 0 )
//                    continue;
                // add topmost literal
                Lits[0] = toLitCond( pCnfPart->pVarNums[pObjPo->Id], f>0 );
                if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
                    assert( 0 );
                nClauses++;
                continue;
            }
            Lits[0] = toLitCond( Vec_IntEntry(vTopVarNums, i-1), 0 );
            Lits[1] = toLitCond( pCnfPart->pVarNums[pObjPo->Id], 1 );
            if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
                assert( 0 );
            Lits[0] = toLitCond( Vec_IntEntry(vTopVarNums, i-1), 1 );
            Lits[1] = toLitCond( pCnfPart->pVarNums[pObjPo->Id], 0 );
            if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
                assert( 0 );
            nClauses += 2;
        }
        // add CNF to the SAT solver
        for ( i = 0; i < pCnfPart->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnfPart->pClauses[i], pCnfPart->pClauses[i+1] ) )
                break;
        if ( i < pCnfPart->nClauses )
        {
//            printf( "SAT solver became UNSAT after adding clauses.\n" );
            RetValue = 1;
            break;
        }

        // create new set of POs to derive new top
        Vec_PtrClear( vTop );
        Vec_PtrPush( vTop, Aig_ManCo(p, 0) );
        Vec_IntClear( vTopVarNums );
        nOldSize = Vec_IntSize(vState);
        Vec_IntFillExtra( vState, nOldSize + Aig_ManRegNum(p), -1 );
        Vec_PtrForEachEntry( Aig_Obj_t *, vBot, pObjPi, i )
        {
            assert( Aig_ObjIsCi(pObjPi) );
            if ( Saig_ObjIsLo(p, pObjPi) )
            {
                pObjPiCopy = (Aig_Obj_t *)pObjPi->pData;
                assert( pObjPiCopy != NULL );
                Vec_PtrPush( vTop, Saig_ObjLoToLi(p, pObjPi) );
                Vec_IntPush( vTopVarNums, pCnfPart->pVarNums[pObjPiCopy->Id] );

                iReg = pObjPi->CioId - Saig_ManPiNum(p);
                assert( iReg >= 0 && iReg < Aig_ManRegNum(p) );
                Vec_IntWriteEntry( vState, nOldSize+iReg, pCnfPart->pVarNums[pObjPiCopy->Id] );
            }
        } 
        assert( Vec_IntSize(vState)%Aig_ManRegNum(p) == 0 );
        iLast = Vec_IntSize(vState)/Aig_ManRegNum(p);
        if ( fUniqueAll )
        {
            for ( i = 1; i < iLast-1; i++ )
            {
                nConstrs++;
                if ( fVeryVerbose )
                    printf( "Adding constaint for state %2d and state %2d.\n", i, iLast-1 );
                if ( Saig_ManAddUniqueness( pSat, vState, Aig_ManRegNum(p), i, iLast-1, &nSatVarNum, &nClauses, fVerbose ) )
                    break;
            }
            if ( i < iLast-1 )
            {
                RetValue = 1;
                break;
            }
        }

nextrun:
        fAdded = 0;
        // run the SAT solver
        nConfPrev = pSat->stats.conflicts;
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfMax, 0, 0, 0 );
        if ( fVerbose )
        {
            printf( "Frame %4d : PI =%5d. PO =%5d. AIG =%5d. Var =%7d. Clau =%7d. Conf =%7d. ",
                f, Aig_ManCiNum(pAigPart), Aig_ManCoNum(pAigPart), Aig_ManNodeNum(pAigPart), 
                nSatVarNum, nClauses, (int)pSat->stats.conflicts-nConfPrev );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( status == l_Undef )
            break;
        if ( status == l_False )
        {
            RetValue = 1;
            break;
        }
        assert( status == l_True );
        // the problem is SAT - add more clauses
        if ( fVeryVerbose )
        {
            Vec_IntForEachEntry( vState, iReg, i )
            {
                if ( i && (i % Aig_ManRegNum(p)) == 0 )
                    printf( "\n" );
                if ( (i % Aig_ManRegNum(p)) == 0 )
                    printf( "       State %3d : ", i/Aig_ManRegNum(p) );
                printf( "%c", (iReg >= 0) ? ('0' + sat_solver_var_value(pSat, iReg)) : 'x' );
            }
            printf( "\n" );
        }
        if ( nFramesMax && f == nFramesMax - 1 )
        {
            // derive counter-example
            assert( status == l_True );
            if ( fGetCex )
            {
                int VarNum, iBit = 0;
                Abc_Cex_t * pCex = Abc_CexAlloc( Aig_ManRegNum(p)-1, Saig_ManPiNum(p), 1 );
                pCex->iFrame = 0;
                pCex->iPo = 0;
                Vec_IntForEachEntryStart( vTopVarIds, VarNum, i, 1 )
                {
                    if ( VarNum >= 0 && sat_solver_var_value( pSat, VarNum ) )
                        Abc_InfoSetBit( pCex->pData, iBit );
                    iBit++;
                }
                assert( iBit == pCex->nBits );
                Abc_CexFree( p->pSeqModel );
                p->pSeqModel = pCex;
            }
            break;
        }
        if ( fUnique )
        {
            for ( i = 1; i < iLast; i++ )
            {
                for ( k = i+1; k < iLast; k++ )
                {
                    if ( !Saig_ManStatesAreEqual( pSat, vState, Aig_ManRegNum(p), i, k ) )
                        continue;
                    nConstrs++;
                    fAdded = 1;
                    if ( fVeryVerbose )
                        printf( "Adding constaint for state %2d and state %2d.\n", i, k );
                    if ( Saig_ManAddUniqueness( pSat, vState, Aig_ManRegNum(p), i, k, &nSatVarNum, &nClauses, fVerbose ) )
                        break;
                }
                if ( k < iLast )
                    break;
            }
            if ( i < iLast )
            {
                RetValue = 1;
                break;
            }
        }
        if ( fAdded )
            goto nextrun;
    }
    if ( fVerbose )
    {
        if ( nTimeToStop && Abc_Clock() >= nTimeToStop )
            printf( "Timeout (%d sec) was reached during iteration %d.\n", nTimeOut, f+1 );
        else if ( status == l_Undef )
            printf( "Conflict limit (%d) was reached during iteration %d.\n", nConfMax, f+1 );
        else if ( fUnique || fUniqueAll )
            printf( "Completed %d iterations and added %d uniqueness constraints.\n", f+1, nConstrs );
        else
            printf( "Completed %d iterations.\n", f+1 );
    }
    // cleanup
    sat_solver_delete( pSat );
    Aig_ManStop( pAigPart );
    Cnf_DataFree( pCnfPart );
    Vec_IntFree( vTopVarNums );
    Vec_PtrFree( vTop );
    Vec_PtrFree( vBot );
    Vec_IntFree( vState );
    Vec_IntFreeP( &vTopVarIds );
    return RetValue;
}